

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_0::FormatFNegativeExpSlow
          (anon_unknown_0 *this,uint128 v,int exp,FormatState *state)

{
  size_t sVar1;
  undefined4 in_register_0000000c;
  FormatState *state_00;
  int iVar2;
  Func f;
  size_t digits_to_go;
  FormatState *local_80;
  undefined1 *local_78;
  Padding local_70;
  FormatState **local_58;
  code *local_50;
  anon_unknown_0 *local_48;
  uint64_t local_40;
  int local_38;
  
  state_00 = (FormatState *)CONCAT44(in_register_0000000c,exp);
  iVar2 = (int)v.hi_;
  sVar1 = state_00->precision;
  if (sVar1 == 0) {
    sVar1 = -(ulong)((state_00->conv->flags_ & kAlt) == kBasic);
  }
  ExtraWidthToPadding(&local_70,(sVar1 + 3) - (ulong)(state_00->sign_char == '\0'),state_00);
  FormatSinkImpl::Append(state_00->sink,local_70.left_spaces,' ');
  if (state_00->sign_char != '\0') {
    FormatSinkImpl::Append(state_00->sink,1,state_00->sign_char);
  }
  FormatSinkImpl::Append(state_00->sink,local_70.zeros + 1,'0');
  if ((state_00->precision == 0) && ((state_00->conv->flags_ & kAlt) == kBasic)) {
    digits_to_go = 0;
  }
  else {
    FormatSinkImpl::Append(state_00->sink,1,'.');
    digits_to_go = state_00->precision;
  }
  local_80 = state_00;
  if (0x407d < iVar2) {
    local_78 = (undefined1 *)&digits_to_go;
    __assert_fail("-exp >= Limits::min_exponent - 128",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                  ,0xff,
                  "static void absl::str_format_internal::(anonymous namespace)::FractionalDigitGenerator::RunConversion(uint128, int, absl::FunctionRef<void (FractionalDigitGenerator)>)"
                 );
  }
  local_58 = &local_80;
  local_50 = functional_internal::
             InvokeObject<absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatFNegativeExpSlow(absl::lts_20250127::uint128,int,absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatState_const&)::__0,void,absl::lts_20250127::str_format_internal::(anonymous_namespace)::FractionalDigitGenerator>
  ;
  f.invoker_ = (Invoker<void,_absl::lts_20250127::Span<unsigned_int>_>)&digits_to_go;
  f.ptr_.fun = functional_internal::
               InvokeObject<absl::lts_20250127::str_format_internal::(anonymous_namespace)::FractionalDigitGenerator::RunConversion(absl::lts_20250127::uint128,int,absl::lts_20250127::FunctionRef<void(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FractionalDigitGenerator)>)::_lambda(absl::lts_20250127::Span<unsigned_int>)_1_,void,absl::lts_20250127::Span<unsigned_int>>
  ;
  local_78 = (undefined1 *)&digits_to_go;
  local_48 = this;
  local_40 = v.lo_;
  local_38 = iVar2;
  StackArray::RunWithCapacity((StackArray *)(ulong)(iVar2 + 0x5fU >> 5),(size_t)&local_58,f);
  FormatSinkImpl::Append(state_00->sink,digits_to_go,'0');
  FormatSinkImpl::Append(state_00->sink,local_70.right_spaces,' ');
  return;
}

Assistant:

void FormatFNegativeExpSlow(uint128 v, int exp, const FormatState &state) {
  const size_t total_digits =
      /* 0 */ 1 + (state.ShouldPrintDot() ? state.precision + 1 : 0);
  auto padding =
      ExtraWidthToPadding(total_digits + (state.sign_char ? 1 : 0), state);
  padding.zeros += 1;
  state.sink->Append(padding.left_spaces, ' ');
  if (state.sign_char != '\0') state.sink->Append(1, state.sign_char);
  state.sink->Append(padding.zeros, '0');

  if (state.ShouldPrintDot()) state.sink->Append(1, '.');

  // Print digits
  size_t digits_to_go = state.precision;

  FractionalDigitGenerator::RunConversion(
      v, exp, [&](FractionalDigitGenerator digit_gen) {
        // There are no digits to print here.
        if (state.precision == 0) return;

        // We go one digit at a time, while keeping track of runs of nines.
        // The runs of nines are used to perform rounding when necessary.

        while (digits_to_go > 0 && digit_gen.HasMoreDigits()) {
          auto digits = digit_gen.GetDigits();

          // Now we have a digit and a run of nines.
          // See if we can print them all.
          if (digits.num_nines + 1 < digits_to_go) {
            // We don't have to round yet, so print them.
            state.sink->Append(1, digits.digit_before_nine + '0');
            state.sink->Append(digits.num_nines, '9');
            digits_to_go -= digits.num_nines + 1;

          } else {
            // We can't print all the nines, see where we have to truncate.

            bool round_up = false;
            if (digits.num_nines + 1 > digits_to_go) {
              // We round up at a nine. No need to print them.
              round_up = true;
            } else {
              // We can fit all the nines, but truncate just after it.
              if (digit_gen.IsGreaterThanHalf()) {
                round_up = true;
              } else if (digit_gen.IsExactlyHalf()) {
                // Round to even
                round_up =
                    digits.num_nines != 0 || digits.digit_before_nine % 2 == 1;
              }
            }

            if (round_up) {
              state.sink->Append(1, digits.digit_before_nine + '1');
              --digits_to_go;
              // The rest will be zeros.
            } else {
              state.sink->Append(1, digits.digit_before_nine + '0');
              state.sink->Append(digits_to_go - 1, '9');
              digits_to_go = 0;
            }
            return;
          }
        }
      });

  state.sink->Append(digits_to_go, '0');
  state.sink->Append(padding.right_spaces, ' ');
}